

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::InitPropertyStringMap(ScriptContext *this,int i)

{
  Recycler *pRVar1;
  PropertyStringMap *pPVar2;
  Cache *pCVar3;
  TrackAllocData local_40;
  int local_14;
  ScriptContext *pSStack_10;
  int i_local;
  ScriptContext *this_local;
  
  local_14 = i;
  pSStack_10 = this;
  pRVar1 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&PropertyStringMap::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x652);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_40);
  pPVar2 = (PropertyStringMap *)new<Memory::Recycler>(0x280,pRVar1,0x43c4b0);
  PropertyStringMap::PropertyStringMap(pPVar2);
  pCVar3 = Cache(this);
  Memory::WriteBarrierPtr<Js::PropertyStringMap>::operator=
            (pCVar3->propertyStrings + local_14,pPVar2);
  pCVar3 = Cache(this);
  pPVar2 = Memory::WriteBarrierPtr<Js::PropertyStringMap>::operator->
                     (pCVar3->propertyStrings + local_14);
  Memory::ClearArray<Memory::WriteBarrierPtr<Js::PropertyString>>(pPVar2->strLen2,0x50);
  return;
}

Assistant:

void ScriptContext::InitPropertyStringMap(int i)
    {
        this->Cache()->propertyStrings[i] = RecyclerNewStruct(GetRecycler(), PropertyStringMap);
        ClearArray(this->Cache()->propertyStrings[i]->strLen2, 80);
    }